

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrApplyHapticFeedback
                   (XrSession session,XrHapticActionInfo *hapticActionInfo,
                   XrHapticBaseHeader *hapticFeedback)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_771;
  string local_770 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_750;
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [39];
  allocator local_6e1;
  string local_6e0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_6c0;
  allocator local_6a1;
  string local_6a0 [39];
  allocator local_679;
  string local_678 [39];
  allocator local_651;
  string local_650 [8];
  string error_message_2;
  allocator local_629;
  string local_628 [32];
  XrHapticPcmVibrationFB *local_608;
  XrHapticPcmVibrationFB *new_hapticpcmvibrationfb_value;
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [8];
  string error_message_1;
  allocator local_569;
  string local_568 [32];
  XrHapticAmplitudeEnvelopeVibrationFB *local_548;
  XrHapticAmplitudeEnvelopeVibrationFB *new_hapticamplitudeenvelopevibrationfb_value;
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [8];
  string error_message;
  allocator local_4a9;
  string local_4a8 [32];
  XrHapticVibration *local_488;
  XrHapticVibration *new_hapticvibration_value;
  string local_478 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_458;
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3c8;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_310;
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  GenValidUsageXrInstanceInfo *local_2a8;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_280 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_260;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  XrSession_T local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_4c;
  undefined1 local_48 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrHapticBaseHeader *hapticFeedback_local;
  XrHapticActionInfo *hapticActionInfo_local;
  XrSession session_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  hapticActionInfo_local = (XrHapticActionInfo *)session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  local_4c = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_48
             ,(XrSession_T **)&hapticActionInfo_local,&local_4c);
  VVar1 = VerifyXrSessionHandle((XrSession *)&hapticActionInfo_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSession_T_*>::getWithInstanceInfo
                      (&g_session_info,(XrSession_T *)hapticActionInfo_local);
    pGVar2 = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2a8 = pGVar2;
    gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar2;
    if (hapticActionInfo == (XrHapticActionInfo *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c8,"VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",&local_2c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"xrApplyHapticFeedback",&local_2f1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_310,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_330,
                 "Invalid NULL for XrHapticActionInfo \"hapticActionInfo\" which is not optional and must be non-NULL"
                 ,&local_331);
      CoreValidLogMessage(pGVar2,(string *)local_2c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2f0,&local_310,(string *)local_330);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_310);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"xrApplyHapticFeedback",&local_359);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_358,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_48,true,true,hapticActionInfo);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      pGVar2 = local_2a8;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        if (hapticFeedback == (XrHapticBaseHeader *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_410,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",&local_411);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_438,"xrApplyHapticFeedback",&local_439);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_458,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_48);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_478,
                     "Invalid NULL for XrHapticBaseHeader \"hapticFeedback\" which is not optional and must be non-NULL"
                     ,(allocator *)((long)&new_hapticvibration_value + 7));
          CoreValidLogMessage(pGVar2,(string *)local_410,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_438,&local_458,(string *)local_478);
          std::__cxx11::string::~string(local_478);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&new_hapticvibration_value + 7));
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_458);
          std::__cxx11::string::~string(local_438);
          std::allocator<char>::~allocator((allocator<char> *)&local_439);
          std::__cxx11::string::~string(local_410);
          std::allocator<char>::~allocator((allocator<char> *)&local_411);
          session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
        }
        else {
          local_488 = (XrHapticVibration *)hapticFeedback;
          if (hapticFeedback->type == XR_TYPE_HAPTIC_VIBRATION) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4a8,"xrApplyHapticFeedback",&local_4a9);
            objects_info.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 ValidateXrStruct(pGVar2,(string *)local_4a8,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)local_48,false,true,local_488);
            std::__cxx11::string::~string(local_4a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
            if (objects_info.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_4d0,"Command xrApplyHapticFeedback param hapticFeedback",&local_4d1);
              std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
              std::__cxx11::string::operator+=(local_4d0," is invalid");
              pGVar2 = local_2a8;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_4f8,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",&local_4f9)
              ;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_520,"xrApplyHapticFeedback",&local_521);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&new_hapticamplitudeenvelopevibrationfb_value,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_48);
              CoreValidLogMessage(pGVar2,(string *)local_4f8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  (string *)local_520,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&new_hapticamplitudeenvelopevibrationfb_value,
                                  (string *)local_4d0);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                       *)&new_hapticamplitudeenvelopevibrationfb_value);
              std::__cxx11::string::~string(local_520);
              std::allocator<char>::~allocator((allocator<char> *)&local_521);
              std::__cxx11::string::~string(local_4f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
              session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
              info_with_instance.second._4_4_ = 1;
              std::__cxx11::string::~string(local_4d0);
              goto LAB_0029ee7d;
            }
          }
          pGVar2 = local_2a8;
          local_548 = (XrHapticAmplitudeEnvelopeVibrationFB *)hapticFeedback;
          if (hapticFeedback->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_568,"xrApplyHapticFeedback",&local_569);
            objects_info.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 ValidateXrStruct(pGVar2,(string *)local_568,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)local_48,false,true,local_548);
            std::__cxx11::string::~string(local_568);
            std::allocator<char>::~allocator((allocator<char> *)&local_569);
            if (objects_info.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_590,"Command xrApplyHapticFeedback param hapticFeedback",&local_591);
              std::allocator<char>::~allocator((allocator<char> *)&local_591);
              std::__cxx11::string::operator+=(local_590," is invalid");
              pGVar2 = local_2a8;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_5b8,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",&local_5b9)
              ;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_5e0,"xrApplyHapticFeedback",&local_5e1);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&new_hapticpcmvibrationfb_value,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_48);
              CoreValidLogMessage(pGVar2,(string *)local_5b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  (string *)local_5e0,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&new_hapticpcmvibrationfb_value,(string *)local_590);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                       *)&new_hapticpcmvibrationfb_value);
              std::__cxx11::string::~string(local_5e0);
              std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
              std::__cxx11::string::~string(local_5b8);
              std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
              session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
              info_with_instance.second._4_4_ = 1;
              std::__cxx11::string::~string(local_590);
              goto LAB_0029ee7d;
            }
          }
          pGVar2 = local_2a8;
          local_608 = (XrHapticPcmVibrationFB *)hapticFeedback;
          if (hapticFeedback->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_628,"xrApplyHapticFeedback",&local_629);
            objects_info.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 ValidateXrStruct(pGVar2,(string *)local_628,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)local_48,false,true,local_608);
            std::__cxx11::string::~string(local_628);
            std::allocator<char>::~allocator((allocator<char> *)&local_629);
            if (objects_info.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_650,"Command xrApplyHapticFeedback param hapticFeedback",&local_651);
              std::allocator<char>::~allocator((allocator<char> *)&local_651);
              std::__cxx11::string::operator+=(local_650," is invalid");
              pGVar2 = local_2a8;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_678,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",&local_679)
              ;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_6a0,"xrApplyHapticFeedback",&local_6a1);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_6c0,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_48);
              CoreValidLogMessage(pGVar2,(string *)local_678,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  (string *)local_6a0,&local_6c0,(string *)local_650);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_6c0);
              std::__cxx11::string::~string(local_6a0);
              std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
              std::__cxx11::string::~string(local_678);
              std::allocator<char>::~allocator((allocator<char> *)&local_679);
              session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
              info_with_instance.second._4_4_ = 1;
              std::__cxx11::string::~string(local_650);
              goto LAB_0029ee7d;
            }
          }
          pGVar2 = local_2a8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_6e0,"xrApplyHapticFeedback",&local_6e1);
          objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               ValidateXrStruct(pGVar2,(string *)local_6e0,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)local_48,true,true,hapticFeedback);
          std::__cxx11::string::~string(local_6e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
          pGVar2 = local_2a8;
          if (objects_info.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
            session_local._4_4_ =
                 objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            info_with_instance.second._4_4_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_708,"VUID-xrApplyHapticFeedback-hapticFeedback-parameter",&local_709);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_730,"xrApplyHapticFeedback",&local_731);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_750,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_48);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_770,"Command xrApplyHapticFeedback param hapticFeedback is invalid",
                       &local_771);
            CoreValidLogMessage(pGVar2,(string *)local_708,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                (string *)local_730,&local_750,(string *)local_770);
            std::__cxx11::string::~string(local_770);
            std::allocator<char>::~allocator((allocator<char> *)&local_771);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_750);
            std::__cxx11::string::~string(local_730);
            std::allocator<char>::~allocator((allocator<char> *)&local_731);
            std::__cxx11::string::~string(local_708);
            std::allocator<char>::~allocator((allocator<char> *)&local_709);
            session_local._4_4_ =
                 objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            info_with_instance.second._4_4_ = 1;
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_380,"VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",&local_381);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3a8,"xrApplyHapticFeedback",&local_3a9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3c8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3e8,"Command xrApplyHapticFeedback param hapticActionInfo is invalid",
                   &local_3e9);
        CoreValidLogMessage(pGVar2,(string *)local_380,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_3a8,&local_3c8,(string *)local_3e8);
        std::__cxx11::string::~string(local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3c8);
        std::__cxx11::string::~string(local_3a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        std::__cxx11::string::~string(local_380);
        std::allocator<char>::~allocator((allocator<char> *)&local_381);
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    std::operator<<((ostream *)local_1d8,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_1f8);
    std::operator<<((ostream *)local_1d8,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_218,"VUID-xrApplyHapticFeedback-session-parameter",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"xrApplyHapticFeedback",&local_241);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_260,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_48);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_218,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_240,&local_260,local_280);
    std::__cxx11::string::~string((string *)local_280);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_260);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
LAB_0029ee7d:
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrApplyHapticFeedback(
XrSession session,
const XrHapticActionInfo* hapticActionInfo,
const XrHapticBaseHeader* hapticFeedback) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrApplyHapticFeedback-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == hapticActionInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback", objects_info,
                                "Invalid NULL for XrHapticActionInfo \"hapticActionInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrHapticActionInfo is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback", objects_info,
                                                        true, true, hapticActionInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticActionInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                objects_info,
                                "Command xrApplyHapticFeedback param hapticActionInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == hapticFeedback) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback", objects_info,
                                "Invalid NULL for XrHapticBaseHeader \"hapticFeedback\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate if XrHapticBaseHeader is a child structure of type XrHapticVibration and it is valid
        {
            const XrHapticVibration* new_hapticvibration_value = reinterpret_cast<const XrHapticVibration*>(hapticFeedback);
            if (new_hapticvibration_value->type == XR_TYPE_HAPTIC_VIBRATION) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback",
                                                                objects_info,false, true, new_hapticvibration_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrApplyHapticFeedback param hapticFeedback";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate if XrHapticBaseHeader is a child structure of type XrHapticAmplitudeEnvelopeVibrationFB and it is valid
        {
            const XrHapticAmplitudeEnvelopeVibrationFB* new_hapticamplitudeenvelopevibrationfb_value = reinterpret_cast<const XrHapticAmplitudeEnvelopeVibrationFB*>(hapticFeedback);
            if (new_hapticamplitudeenvelopevibrationfb_value->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback",
                                                                objects_info,false, true, new_hapticamplitudeenvelopevibrationfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrApplyHapticFeedback param hapticFeedback";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate if XrHapticBaseHeader is a child structure of type XrHapticPcmVibrationFB and it is valid
        {
            const XrHapticPcmVibrationFB* new_hapticpcmvibrationfb_value = reinterpret_cast<const XrHapticPcmVibrationFB*>(hapticFeedback);
            if (new_hapticpcmvibrationfb_value->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback",
                                                                objects_info,false, true, new_hapticpcmvibrationfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrApplyHapticFeedback param hapticFeedback";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate that the base-structure XrHapticBaseHeader is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrApplyHapticFeedback", objects_info,
                                                        true, true, hapticFeedback);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrApplyHapticFeedback-hapticFeedback-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrApplyHapticFeedback",
                                objects_info,
                                "Command xrApplyHapticFeedback param hapticFeedback is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}